

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dgrsubgraph_mining_enumerate.cpp
# Opt level: O0

void __thiscall
DGRSubgraphMiningEnumerate_single_graph_single_occurrence_with_new_measures_Test::TestBody
          (DGRSubgraphMiningEnumerate_single_graph_single_occurrence_with_new_measures_Test *this)

{
  allocator<int> *paVar1;
  allocator<std::vector<int,_std::allocator<int>_>_> *this_00;
  allocator<std::array<int,_8UL>_> *this_01;
  allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_> *this_02;
  allocator<std::array<int,_3UL>_> *this_03;
  allocator<std::array<int,_10UL>_> *this_04;
  __node_base_ptr *this_05;
  size_t *this_06;
  allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_> *paVar2;
  initializer_list<int> __l;
  initializer_list<std::set<int,_std::less<int>,_std::allocator<int>_>_> __l_00;
  initializer_list<int> __l_01;
  initializer_list<std::set<int,_std::less<int>,_std::allocator<int>_>_> __l_02;
  initializer_list<int> __l_03;
  initializer_list<std::set<int,_std::less<int>,_std::allocator<int>_>_> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<std::array<int,_10UL>_> __l_07;
  initializer_list<std::array<int,_3UL>_> __l_08;
  initializer_list<std::array<int,_8UL>_> __l_09;
  initializer_list<std::array<int,_8UL>_> __l_10;
  initializer_list<std::array<int,_8UL>_> __l_11;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_12;
  initializer_list<int> __l_13;
  initializer_list<int> __l_14;
  initializer_list<int> __l_15;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_16;
  bool bVar3;
  char *pcVar4;
  mapped_type *this_07;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  pair<std::_Rb_tree_const_iterator<dgrminer::children_candidate>,_bool> pVar6;
  set<int,_std::less<int>,_std::allocator<int>_> *local_c38;
  set<int,_std::less<int>,_std::allocator<int>_> *local_b98;
  set<int,_std::less<int>,_std::allocator<int>_> *local_b68;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_a68;
  vector<int,_std::allocator<int>_> *local_a20;
  AssertHelper local_9e0;
  Message local_9d8;
  undefined1 local_9d0 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_9b8 [8];
  unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  multiple_occurrences_ground_truth;
  int local_978 [2];
  iterator local_970;
  size_type local_968;
  set<int,_std::less<int>,_std::allocator<int>_> *local_960;
  set<int,_std::less<int>,_std::allocator<int>_> local_958;
  iterator local_928;
  size_type local_920;
  undefined1 local_918 [8];
  set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  occurrence_nodes;
  Message local_8e0;
  undefined1 local_8d8 [8];
  AssertionResult gtest_ar_2;
  Message local_8c0;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar_1;
  set<int,_std::less<int>,_std::allocator<int>_> local_888;
  iterator local_858;
  size_type local_850;
  undefined1 local_848 [8];
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  edges_occupied_by_antecedent_ground_truth;
  int local_828 [2];
  iterator local_820;
  size_type local_818;
  set<int,_std::less<int>,_std::allocator<int>_> *local_810;
  set<int,_std::less<int>,_std::allocator<int>_> local_808;
  iterator local_7d8;
  size_type local_7d0;
  undefined1 local_7c8 [8];
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  nodes_occupied_by_antecedent_ground_truth;
  AssertHelper local_7a8;
  Message local_7a0;
  undefined1 local_798 [8];
  AssertionResult gtest_ar;
  undefined1 local_768 [8];
  set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
  children_ground_truth;
  value_type local_724;
  allocator<int> local_71e;
  less<int> local_71d;
  int local_71c;
  iterator local_718;
  size_type local_710;
  undefined1 local_708 [8];
  set<int,_std::less<int>,_std::allocator<int>_> occurrences_2;
  array<int,_10UL> elements_2;
  undefined1 auStack_6a8 [8];
  children_candidate children_candidate_2;
  value_type local_5fc;
  undefined1 auStack_5f8 [8];
  children_candidate children_candidate_1;
  allocator<int> local_55e;
  less<int> local_55d;
  int local_55c;
  iterator local_558;
  size_type local_550;
  undefined1 local_548 [8];
  set<int,_std::less<int>,_std::allocator<int>_> occurrences_1;
  array<int,_10UL> elements_1;
  set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
  children;
  unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  multiple_antecedent_occurrences;
  unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  multiple_occurrences;
  undefined1 auStack_448 [6];
  bool new_measures;
  int aiStack_440 [10];
  iterator local_418;
  size_type local_410;
  undefined1 local_408 [8];
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> pattern_edge_list;
  undefined1 auStack_3e8 [8];
  AdjacencyListCrate alc;
  undefined1 local_398 [16];
  undefined8 local_388;
  undefined8 uStack_380;
  undefined4 local_378;
  iterator local_368;
  size_type local_360;
  undefined1 local_358 [8];
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> adjacencyListNodes;
  pointer local_338;
  int aiStack_330 [2];
  int local_328 [2];
  int aiStack_320 [2];
  array<int,_8UL> local_318;
  iterator local_2f8;
  size_type local_2f0;
  allocator<std::array<int,_8UL>_> local_2e1;
  array<int,_8UL> local_2e0;
  int local_2c0 [2];
  int aiStack_2b8 [2];
  int local_2b0 [2];
  int aiStack_2a8 [2];
  iterator local_2a0;
  size_type local_298;
  allocator<std::array<int,_8UL>_> local_289;
  array<int,_8UL> local_288;
  array<int,_8UL> local_268;
  iterator local_240;
  size_type local_238;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_230;
  undefined1 local_228 [48];
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_1f8;
  undefined1 local_1e0 [24];
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacencyEdgeInfo;
  array<int,_8UL> e_info2;
  array<int,_8UL> e_info1;
  array<int,_8UL> e_info0;
  int local_150 [2];
  iterator local_148;
  size_type local_140;
  allocator<int> local_131;
  int local_130 [2];
  iterator local_128;
  size_type local_120;
  allocator<int> local_101;
  int local_100 [2];
  iterator local_f8;
  size_type local_f0;
  vector<int,_std::allocator<int>_> *local_e8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  undefined1 local_98 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacencyList;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  edges_occupied_by_antecedent;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  nodes_occupied_by_antecedent;
  vector<int,_std::allocator<int>_> graph_ids;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
  adjacency_lists;
  DGRSubgraphMiningEnumerate_single_graph_single_occurrence_with_new_measures_Test *this_local;
  
  std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::vector
            ((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> *)
             &graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &nodes_occupied_by_antecedent.
              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            *)&edges_occupied_by_antecedent.
               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            *)&adjacencyList.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  e_info0._M_elems[7]._2_1_ = 1;
  local_100[0] = 1;
  local_100[1] = 2;
  local_f8 = local_100;
  local_f0 = 2;
  local_e8 = &local_e0;
  std::allocator<int>::allocator(&local_101);
  __l_15._M_len = local_f0;
  __l_15._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l_15,&local_101);
  local_130[0] = 0;
  local_130[1] = 2;
  local_128 = local_130;
  local_120 = 2;
  local_e8 = &local_c8;
  std::allocator<int>::allocator(&local_131);
  __l_14._M_len = local_120;
  __l_14._M_array = local_128;
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l_14,&local_131);
  local_150[0] = 0;
  local_150[1] = 1;
  local_148 = local_150;
  local_140 = 2;
  paVar1 = (allocator<int> *)((long)e_info0._M_elems + 0x1f);
  local_e8 = &local_b0;
  std::allocator<int>::allocator(paVar1);
  __l_13._M_len = local_140;
  __l_13._M_array = local_148;
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,__l_13,paVar1);
  e_info0._M_elems[7]._2_1_ = 0;
  local_98._0_8_ = &local_e0;
  local_98._8_8_ = (pointer)0x3;
  this_00 = (allocator<std::vector<int,_std::allocator<int>_>_> *)((long)e_info0._M_elems + 0x1d);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(this_00);
  __l_16._M_len = local_98._8_8_;
  __l_16._M_array = (iterator)local_98._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_98 + 0x10),__l_16,this_00);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)e_info0._M_elems + 0x1d));
  local_a20 = (vector<int,_std::allocator<int>_> *)local_98;
  do {
    local_a20 = local_a20 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_a20);
  } while (local_a20 != &local_e0);
  std::allocator<int>::~allocator((allocator<int> *)((long)e_info0._M_elems + 0x1f));
  std::allocator<int>::~allocator(&local_131);
  std::allocator<int>::~allocator(&local_101);
  e_info0._M_elems[2] = 0;
  e_info0._M_elems[3] = 0x14;
  e_info0._M_elems[4] = -10;
  e_info0._M_elems[5] = 0;
  e_info1._M_elems[6] = 10;
  e_info1._M_elems[7] = -5;
  e_info0._M_elems[0] = 0;
  e_info0._M_elems[1] = 100;
  e_info1._M_elems[2] = 0;
  e_info1._M_elems[3] = 0x1e;
  e_info1._M_elems[4] = -0xf;
  e_info1._M_elems[5] = 1;
  e_info2._M_elems[6] = 0x14;
  e_info2._M_elems[7] = -10;
  e_info1._M_elems[0] = 0;
  e_info1._M_elems[1] = 0x65;
  e_info2._M_elems[2] = 0;
  e_info2._M_elems[3] = 10;
  e_info2._M_elems[4] = -5;
  e_info2._M_elems[5] = 2;
  adjacencyEdgeInfo.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xfffffff10000001e;
  e_info2._M_elems[0] = 0;
  e_info2._M_elems[1] = 0x66;
  adjacencyListNodes.
  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_230 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_228;
  local_288._M_elems[4] = 0;
  local_288._M_elems[5] = 0x14;
  local_288._M_elems[6] = -10;
  local_288._M_elems[7] = 0;
  local_288._M_elems[0] = 10;
  local_288._M_elems[1] = -5;
  local_288._M_elems[2] = 0;
  local_288._M_elems[3] = 100;
  dgrminer::flipAdjacencyInfo
            (&local_268,
             (array<int,_8UL> *)
             &adjacencyEdgeInfo.
              super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_240 = &local_288;
  local_238 = 2;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_289);
  __l_11._M_len = local_238;
  __l_11._M_array = local_240;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_228,
             __l_11,&local_289);
  local_230 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
              (local_228 + 0x18);
  dgrminer::flipAdjacencyInfo(&local_2e0,(array<int,_8UL> *)(e_info1._M_elems + 6));
  local_2b0[0] = e_info1._M_elems[2];
  local_2b0[1] = e_info1._M_elems[3];
  aiStack_2a8[0] = e_info1._M_elems[4];
  aiStack_2a8[1] = e_info1._M_elems[5];
  local_2c0[0] = e_info2._M_elems[6];
  local_2c0[1] = e_info2._M_elems[7];
  aiStack_2b8[0] = e_info1._M_elems[0];
  aiStack_2b8[1] = e_info1._M_elems[1];
  local_2a0 = &local_2e0;
  local_298 = 2;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_2e1);
  __l_10._M_len = local_298;
  __l_10._M_array = local_2a0;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_228 + 0x18),__l_10,&local_2e1);
  local_328[0] = e_info2._M_elems[2];
  local_328[1] = e_info2._M_elems[3];
  aiStack_320[0] = e_info2._M_elems[4];
  aiStack_320[1] = e_info2._M_elems[5];
  local_338 = adjacencyEdgeInfo.
              super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  aiStack_330[0] = e_info2._M_elems[0];
  aiStack_330[1] = e_info2._M_elems[1];
  local_230 = &local_1f8;
  dgrminer::flipAdjacencyInfo(&local_318,(array<int,_8UL> *)(e_info2._M_elems + 6));
  local_2f8 = (iterator)&local_338;
  local_2f0 = 2;
  this_01 = (allocator<std::array<int,_8UL>_> *)
            ((long)&adjacencyListNodes.
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::array<int,_8UL>_>::allocator(this_01);
  __l_09._M_len = local_2f0;
  __l_09._M_array = local_2f8;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_1f8,__l_09,this_01);
  adjacencyListNodes.
  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_1e0._0_8_ = local_228;
  local_1e0._8_8_ = (pointer)0x3;
  this_02 = (allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_> *
            )((long)&adjacencyListNodes.
                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
  allocator(this_02);
  __l_12._M_len = local_1e0._8_8_;
  __l_12._M_array = (iterator)local_1e0._0_8_;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
            *)(local_1e0 + 0x10),__l_12,this_02);
  std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
  ~allocator((allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
              *)((long)&adjacencyListNodes.
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_a68 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_1e0;
  do {
    local_a68 = local_a68 + -1;
    std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector(local_a68);
  } while (local_a68 !=
           (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_228);
  std::allocator<std::array<int,_8UL>_>::~allocator
            ((allocator<std::array<int,_8UL>_> *)
             ((long)&adjacencyListNodes.
                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_2e1);
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_289);
  local_388 = 0x14fffffff6;
  uStack_380 = 0xfffffff100000002;
  local_398._0_4_ = 0;
  local_398._4_4_ = -5;
  local_398._8_8_ = 0x10000000a;
  local_378 = 0x1e;
  local_368 = (iterator)local_398;
  local_360 = 3;
  this_03 = (allocator<std::array<int,_3UL>_> *)
            ((long)&alc.nodes.
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::array<int,_3UL>_>::allocator(this_03);
  __l_08._M_len = local_360;
  __l_08._M_array = local_368;
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)local_358,
             __l_08,this_03);
  std::allocator<std::array<int,_3UL>_>::~allocator
            ((allocator<std::array<int,_3UL>_> *)
             ((long)&alc.nodes.
                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  alc.adjacencyEdgeInfo.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  alc.nodes.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  alc.adjacencyEdgeInfo.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  alc.adjacencyEdgeInfo.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  alc.adjacencyList.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  alc.adjacencyList.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_3e8 = (undefined1  [8])0x0;
  alc.adjacencyList.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  alc.nodes.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  dgrminer::AdjacencyListCrate::AdjacencyListCrate((AdjacencyListCrate *)auStack_3e8);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::operator=((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               *)&alc.adjacencyList.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
              (vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               *)(local_1e0 + 0x10));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)auStack_3e8,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)(local_98 + 0x10));
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             &alc.adjacencyEdgeInfo.
              super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)local_358);
  std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
  push_back((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> *)
            &graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage,(value_type *)auStack_3e8);
  pattern_edge_list.
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             &nodes_occupied_by_antecedent.
              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (value_type *)
             ((long)&pattern_edge_list.
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  aiStack_440[2] = 0;
  aiStack_440[3] = 0x65;
  aiStack_440[4] = 0;
  aiStack_440[5] = 0x1e;
  auStack_448._0_4_ = 0;
  stack0xfffffffffffffbbc = 1;
  aiStack_440[0] = 0x14;
  aiStack_440[1] = -10;
  aiStack_440[6] = -0xf;
  aiStack_440[7] = 0;
  local_418 = (iterator)auStack_448;
  local_410 = 1;
  this_04 = (allocator<std::array<int,_10UL>_> *)
            ((long)&multiple_occurrences._M_h._M_single_bucket + 7);
  std::allocator<std::array<int,_10UL>_>::allocator(this_04);
  __l_07._M_len = local_410;
  __l_07._M_array = local_418;
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
            ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)local_408,
             __l_07,this_04);
  std::allocator<std::array<int,_10UL>_>::~allocator
            ((allocator<std::array<int,_10UL>_> *)
             ((long)&multiple_occurrences._M_h._M_single_bucket + 7));
  multiple_occurrences._M_h._M_single_bucket._6_1_ = 1;
  this_05 = &multiple_antecedent_occurrences._M_h._M_single_bucket;
  std::
  unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ::unordered_map((unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                   *)this_05);
  this_06 = &children._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ::unordered_map((unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                   *)this_06);
  dgrminer::enumerate((set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                       *)(elements_1._M_elems + 8),
                      (vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                       *)&graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                      (vector<int,_std::allocator<int>_> *)
                      &nodes_occupied_by_antecedent.
                       super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                      local_408,
                      (vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       *)&edges_occupied_by_antecedent.
                          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       *)&adjacencyList.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (bool)(multiple_occurrences._M_h._M_single_bucket._6_1_ & 1),
                      (unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                       *)this_05,
                      (unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                       *)this_06);
  elements_1._M_elems[2] = 0;
  elements_1._M_elems[3] = 0x66;
  elements_1._M_elems[4] = 0;
  elements_1._M_elems[5] = 10;
  occurrences_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x200000001;
  elements_1._M_elems[0] = 0x1e;
  elements_1._M_elems[1] = -0xf;
  elements_1._M_elems[6] = -5;
  elements_1._M_elems[7] = 2;
  local_55c = 0;
  local_558 = &local_55c;
  local_550 = 1;
  std::allocator<int>::allocator(&local_55e);
  __l_06._M_len = local_550;
  __l_06._M_array = local_558;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_548,__l_06,&local_55d,
             &local_55e);
  std::allocator<int>::~allocator(&local_55e);
  dgrminer::children_candidate::children_candidate((children_candidate *)auStack_5f8);
  children_candidate_1.elements._M_elems[6] = elements_1._M_elems[6];
  children_candidate_1.elements._M_elems[7] = elements_1._M_elems[7];
  children_candidate_1.elements._M_elems[2] = elements_1._M_elems[2];
  children_candidate_1.elements._M_elems[3] = elements_1._M_elems[3];
  children_candidate_1.elements._M_elems[4] = elements_1._M_elems[4];
  children_candidate_1.elements._M_elems[5] = elements_1._M_elems[5];
  auStack_5f8 = (undefined1  [8])occurrences_1._M_t._M_impl.super__Rb_tree_header._M_node_count;
  children_candidate_1.elements._M_elems[0] = elements_1._M_elems[0];
  children_candidate_1.elements._M_elems[1] = elements_1._M_elems[1];
  local_5fc = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             (children_candidate_1.elements._M_elems + 8),&local_5fc);
  dgrminer::children_candidate::children_candidate((children_candidate *)auStack_6a8);
  occurrences_2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x200000000;
  local_71c = 0;
  local_718 = &local_71c;
  local_710 = 1;
  std::allocator<int>::allocator(&local_71e);
  __l_05._M_len = local_710;
  __l_05._M_array = local_718;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_708,__l_05,&local_71d,
             &local_71e);
  std::allocator<int>::~allocator(&local_71e);
  children_candidate_2.elements._M_elems[6] = -5;
  children_candidate_2.elements._M_elems[7] = 0;
  children_candidate_2.elements._M_elems[2] = 0;
  children_candidate_2.elements._M_elems[3] = 100;
  children_candidate_2.elements._M_elems[4] = 0;
  children_candidate_2.elements._M_elems[5] = 10;
  auStack_6a8 = (undefined1  [8])occurrences_2._M_t._M_impl.super__Rb_tree_header._M_node_count;
  children_candidate_2.elements._M_elems[0] = 0x14;
  children_candidate_2.elements._M_elems[1] = -10;
  local_724 = 0;
  pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     (children_candidate_2.elements._M_elems + 8),&local_724);
  children_ground_truth._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)pVar5.first._M_node;
  std::
  set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
  ::set((set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
         *)local_768);
  std::
  set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
  ::insert((set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
            *)local_768,(value_type *)auStack_5f8);
  pVar6 = std::
          set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
          ::insert((set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                    *)local_768,(value_type *)auStack_6a8);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar6.first._M_node;
  testing::internal::EqHelper<false>::
  Compare<std::set<dgrminer::children_candidate,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>,std::set<dgrminer::children_candidate,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>>
            ((EqHelper<false> *)local_798,"children","children_ground_truth",
             (set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
              *)(elements_1._M_elems + 8),
             (set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
              *)local_768);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar3) {
    testing::Message::Message(&local_7a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
    testing::internal::AssertHelper::AssertHelper
              (&local_7a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_enumerate.cpp"
               ,0x95,pcVar4);
    testing::internal::AssertHelper::operator=(&local_7a8,&local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_7a8);
    testing::Message::~Message(&local_7a0);
  }
  nodes_occupied_by_antecedent_ground_truth.
  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  nodes_occupied_by_antecedent_ground_truth.
  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar3;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  if (nodes_occupied_by_antecedent_ground_truth.
      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    edges_occupied_by_antecedent_ground_truth.
    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
    local_828[0] = 1;
    local_828[1] = 2;
    local_820 = local_828;
    local_818 = 2;
    paVar1 = (allocator<int> *)
             ((long)&edges_occupied_by_antecedent_ground_truth.
                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
    local_810 = &local_808;
    std::allocator<int>::allocator(paVar1);
    __l_03._M_len = local_818;
    __l_03._M_array = local_820;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              (&local_808,__l_03,
               (less<int> *)
               ((long)&edges_occupied_by_antecedent_ground_truth.
                       super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),paVar1);
    edges_occupied_by_antecedent_ground_truth.
    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
    local_7d8 = &local_808;
    local_7d0 = 1;
    paVar2 = (allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
             ((long)&edges_occupied_by_antecedent_ground_truth.
                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::allocator(paVar2);
    __l_04._M_len = local_7d0;
    __l_04._M_array = local_7d8;
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              *)local_7c8,__l_04,paVar2);
    std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::~allocator
              ((allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
               ((long)&edges_occupied_by_antecedent_ground_truth.
                       super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_b68 = (set<int,_std::less<int>,_std::allocator<int>_> *)&local_7d8;
    do {
      local_b68 = local_b68 + -1;
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set(local_b68);
    } while (local_b68 != &local_808);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&edges_occupied_by_antecedent_ground_truth.
                       super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    gtest_ar_1.message_.ptr_._1_1_ = 1;
    gtest_ar_1.message_.ptr_._4_4_ = 1;
    paVar1 = (allocator<int> *)((long)&gtest_ar_1.message_.ptr_ + 2);
    std::allocator<int>::allocator(paVar1);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)((long)&gtest_ar_1.message_.ptr_ + 4);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              (&local_888,__l_01,(less<int> *)((long)&gtest_ar_1.message_.ptr_ + 3),paVar1);
    gtest_ar_1.message_.ptr_._1_1_ = 0;
    local_858 = &local_888;
    local_850 = 1;
    std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::allocator
              ((allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
               &gtest_ar_1.message_);
    __l_02._M_len = local_850;
    __l_02._M_array = local_858;
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              *)local_848,__l_02,(allocator_type *)&gtest_ar_1.message_);
    std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::~allocator
              ((allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
               &gtest_ar_1.message_);
    local_b98 = (set<int,_std::less<int>,_std::allocator<int>_> *)&local_858;
    do {
      local_b98 = local_b98 + -1;
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set(local_b98);
    } while (local_b98 != &local_888);
    std::allocator<int>::~allocator((allocator<int> *)((long)&gtest_ar_1.message_.ptr_ + 2));
    testing::internal::EqHelper<false>::
    Compare<std::vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>,std::vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>>
              ((EqHelper<false> *)local_8b8,"nodes_occupied_by_antecedent",
               "nodes_occupied_by_antecedent_ground_truth",
               (vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                *)&edges_occupied_by_antecedent.
                   super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                *)local_7c8);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
    if (!bVar3) {
      testing::Message::Message(&local_8c0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_enumerate.cpp"
                 ,0x9a,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_8c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_8c0);
    }
    nodes_occupied_by_antecedent_ground_truth.
    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    nodes_occupied_by_antecedent_ground_truth.
    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar3;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
    if (nodes_occupied_by_antecedent_ground_truth.
        super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      testing::internal::EqHelper<false>::
      Compare<std::vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>,std::vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>>
                ((EqHelper<false> *)local_8d8,"edges_occupied_by_antecedent",
                 "edges_occupied_by_antecedent_ground_truth",
                 (vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)&adjacencyList.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)local_848);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d8);
      if (!bVar3) {
        testing::Message::Message(&local_8e0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8d8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &occurrence_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_enumerate.cpp"
                   ,0x9b,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &occurrence_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_8e0);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &occurrence_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count);
        testing::Message::~Message(&local_8e0);
      }
      nodes_occupied_by_antecedent_ground_truth.
      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      nodes_occupied_by_antecedent_ground_truth.
      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar3;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
      if (nodes_occupied_by_antecedent_ground_truth.
          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        multiple_occurrences_ground_truth._M_h._M_single_bucket._5_1_ = 1;
        local_978[0] = 1;
        local_978[1] = 2;
        local_970 = local_978;
        local_968 = 2;
        paVar1 = (allocator<int> *)
                 ((long)&multiple_occurrences_ground_truth._M_h._M_single_bucket + 6);
        local_960 = &local_958;
        std::allocator<int>::allocator(paVar1);
        __l._M_len = local_968;
        __l._M_array = local_970;
        std::set<int,_std::less<int>,_std::allocator<int>_>::set
                  (&local_958,__l,
                   (less<int> *)((long)&multiple_occurrences_ground_truth._M_h._M_single_bucket + 7)
                   ,paVar1);
        multiple_occurrences_ground_truth._M_h._M_single_bucket._5_1_ = 0;
        local_928 = &local_958;
        local_920 = 1;
        paVar2 = (allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
                 ((long)&multiple_occurrences_ground_truth._M_h._M_single_bucket + 3);
        std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::allocator(paVar2);
        __l_00._M_len = local_920;
        __l_00._M_array = local_928;
        std::
        set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
        ::set((set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               *)local_918,__l_00,
              (less<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
              ((long)&multiple_occurrences_ground_truth._M_h._M_single_bucket + 4),paVar2);
        std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::~allocator
                  ((allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
                   ((long)&multiple_occurrences_ground_truth._M_h._M_single_bucket + 3));
        local_c38 = (set<int,_std::less<int>,_std::allocator<int>_> *)&local_928;
        do {
          local_c38 = local_c38 + -1;
          std::set<int,_std::less<int>,_std::allocator<int>_>::~set(local_c38);
        } while (local_c38 != &local_958);
        std::allocator<int>::~allocator
                  ((allocator<int> *)
                   ((long)&multiple_occurrences_ground_truth._M_h._M_single_bucket + 6));
        std::
        unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
        ::unordered_map((unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                         *)local_9b8);
        gtest_ar_3.message_.ptr_._4_4_ = 0;
        this_07 = std::
                  unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                  ::operator[]((unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                                *)local_9b8,(key_type *)((long)&gtest_ar_3.message_.ptr_ + 4));
        std::
        set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
        ::operator=(this_07,(set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             *)local_918);
        testing::internal::EqHelper<false>::
        Compare<std::unordered_map<int,std::set<std::set<int,std::less<int>,std::allocator<int>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::set<std::set<int,std::less<int>,std::allocator<int>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>>>>,std::unordered_map<int,std::set<std::set<int,std::less<int>,std::allocator<int>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::set<std::set<int,std::less<int>,std::allocator<int>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>>>>>
                  ((EqHelper<false> *)local_9d0,"multiple_occurrences",
                   "multiple_occurrences_ground_truth",
                   (unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                    *)&multiple_antecedent_occurrences._M_h._M_single_bucket,
                   (unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                    *)local_9b8);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d0);
        if (!bVar3) {
          testing::Message::Message(&local_9d8);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9d0);
          testing::internal::AssertHelper::AssertHelper
                    (&local_9e0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_enumerate.cpp"
                     ,0xa0,pcVar4);
          testing::internal::AssertHelper::operator=(&local_9e0,&local_9d8);
          testing::internal::AssertHelper::~AssertHelper(&local_9e0);
          testing::Message::~Message(&local_9d8);
        }
        nodes_occupied_by_antecedent_ground_truth.
        super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
        nodes_occupied_by_antecedent_ground_truth.
        super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar3;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d0);
        if (nodes_occupied_by_antecedent_ground_truth.
            super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          nodes_occupied_by_antecedent_ground_truth.
          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        std::
        unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
        ::~unordered_map((unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                          *)local_9b8);
        std::
        set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
        ::~set((set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                *)local_918);
      }
    }
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::~vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               *)local_848);
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::~vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               *)local_7c8);
  }
  std::
  set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
  ::~set((set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
          *)local_768);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_708);
  dgrminer::children_candidate::~children_candidate((children_candidate *)auStack_6a8);
  dgrminer::children_candidate::~children_candidate((children_candidate *)auStack_5f8);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_548);
  std::
  set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
  ::~set((set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
          *)(elements_1._M_elems + 8));
  std::
  unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ::~unordered_map((unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                    *)&children._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ::~unordered_map((unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                    *)&multiple_antecedent_occurrences._M_h._M_single_bucket);
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
            ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)local_408);
  dgrminer::AdjacencyListCrate::~AdjacencyListCrate((AdjacencyListCrate *)auStack_3e8);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)local_358);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
             *)(local_1e0 + 0x10));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_98 + 0x10));
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::~vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             *)&adjacencyList.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::~vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             *)&edges_occupied_by_antecedent.
                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &nodes_occupied_by_antecedent.
              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::~vector
            ((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> *)
             &graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(DGRSubgraphMiningEnumerate, single_graph_single_occurrence_with_new_measures)
{
    std::vector<AdjacencyListCrate> adjacency_lists;
    std::vector<int> graph_ids;
    std::vector<std::set<int>> nodes_occupied_by_antecedent;
    std::vector<std::set<int>> edges_occupied_by_antecedent;


    std::vector<std::vector<int>> adjacencyList = {
            {1, 2},
            {0, 2},
            {0, 1}
    };
    std::array<int, ADJ_INFO___SIZE> e_info0 = {10,  -5, 0, 100, 0, 20, -10, 0}; // = flipAdjacencyInfo(newedges[e_index]
    std::array<int, ADJ_INFO___SIZE> e_info1 = {20, -10, 0, 101, 0, 30, -15, 1};
    std::array<int, ADJ_INFO___SIZE> e_info2 = {30, -15, 0, 102, 0, 10,  -5, 2};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacencyEdgeInfo = {
            {e_info0, flipAdjacencyInfo(e_info2)},
            {flipAdjacencyInfo(e_info0), e_info1},
            {e_info2, flipAdjacencyInfo(e_info1)}
    };
    std::vector<std::array<int, ADJ_NODES___SIZE>> adjacencyListNodes = {
            {0,  -5, 10},
            {1, -10, 20},
            {2, -15, 30}
    };
    AdjacencyListCrate alc = AdjacencyListCrate();
    alc.adjacencyEdgeInfo = adjacencyEdgeInfo;
    alc.adjacencyList = adjacencyList;
    alc.nodes = adjacencyListNodes;
    adjacency_lists.push_back(alc);
    graph_ids.push_back(0);

    std::vector<std::array<int, PAT___SIZE>> pattern_edge_list = {
            {0, 1, 20, -10, 0, 101, 0, 30, -15, 0}
    };
    bool new_measures = true;
    std::unordered_map<int, std::set<std::set<int>>> multiple_occurrences;
    std::unordered_map<int, std::set<std::set<int>>> multiple_antecedent_occurrences;

    std::set<children_candidate> children = enumerate(adjacency_lists, graph_ids, pattern_edge_list,
                                                      nodes_occupied_by_antecedent, edges_occupied_by_antecedent,
                                                      new_measures, multiple_occurrences,
                                                      multiple_antecedent_occurrences);

    std::array<int, 10> elements_1 = {1, 2, 30, -15, 0, 102, 0, 10, -5, 2};
    std::set<int> occurrences_1 = {0};
    children_candidate children_candidate_1;
    children_candidate_1.elements = elements_1;
    children_candidate_1.occurrences.insert(0);
    children_candidate children_candidate_2;
    std::array<int, 10> elements_2 = {0, 2, 20, -10, 0, 100, 0, 10, -5, 0 };
    std::set<int> occurrences_2 = {0};
    children_candidate_2.elements = elements_2;
    children_candidate_2.occurrences.insert(0);

    std::set<children_candidate> children_ground_truth;
    children_ground_truth.insert(children_candidate_1);
    children_ground_truth.insert(children_candidate_2);

    ASSERT_EQ(children, children_ground_truth);

    std::vector<std::set<int>> nodes_occupied_by_antecedent_ground_truth = {{1, 2}};
    std::vector<std::set<int>> edges_occupied_by_antecedent_ground_truth = {{1}};

    ASSERT_EQ(nodes_occupied_by_antecedent, nodes_occupied_by_antecedent_ground_truth);
    ASSERT_EQ(edges_occupied_by_antecedent, edges_occupied_by_antecedent_ground_truth);

    std::set<std::set<int>> occurrence_nodes = {{1, 2}};
    std::unordered_map<int, std::set<std::set<int>>> multiple_occurrences_ground_truth;
    multiple_occurrences_ground_truth[0] = occurrence_nodes;
    ASSERT_EQ(multiple_occurrences, multiple_occurrences_ground_truth);
}